

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4afdb9::FunctionParam::printLeft(FunctionParam *this,OutputStream *S)

{
  StringView R;
  
  R.Last = "";
  R.First = "fp";
  OutputStream::operator+=(S,R);
  OutputStream::operator+=(S,this->Number);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "fp";
    S += Number;
  }